

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O2

int __thiscall UEFITool::init(UEFITool *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TreeModel *this_00;
  FfsParser *pFVar2;
  char *pcVar3;
  QPalette palette;
  QObject local_98 [8];
  QObject local_90 [8];
  QObject local_88 [8];
  QObject local_80 [8];
  QObject local_78 [8];
  QObject local_70 [8];
  QObject local_68 [8];
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QArrayDataPointer<char16_t> local_48;
  
  QListWidget::clear();
  QListWidget::clear();
  QTableWidget::clear();
  QTableWidget::setRowCount((int)*(undefined8 *)(this->ui + 0x188));
  QTableWidget::setColumnCount((int)*(undefined8 *)(this->ui + 0x188));
  QPlainTextEdit::clear();
  QPlainTextEdit::clear();
  QTabWidget::setTabEnabled((int)*(undefined8 *)(this->ui + 0x150),true);
  QTabWidget::setTabEnabled((int)*(undefined8 *)(this->ui + 0x150),true);
  QTabWidget::setTabEnabled((int)*(undefined8 *)(this->ui + 0x150),true);
  QTabWidget::setTabEnabled((int)*(undefined8 *)(this->ui + 0x150),true);
  tr((QString *)&local_48,"UEFITool %1",(char *)0x0,-1);
  QString::arg((QString *)&palette,(int)&local_48,(QChar)((short)this + L'à'));
  QWidget::setWindowTitle((QString *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&palette);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QAction::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x68),0));
  QAction::setEnabled(SUB81(*(undefined8 *)(this->ui + 0xb0),0));
  QAction::setEnabled(SUB81(*(undefined8 *)(this->ui + 0xd0),0));
  QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x200),0));
  QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x208),0));
  QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x210),0));
  QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x218),0));
  QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x220),0));
  QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x228),0));
  QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x230),0));
  QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x248),0));
  QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x240),0));
  QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x238),0));
  if (this->model != (TreeModel *)0x0) {
    (**(code **)(*(long *)this->model + 0x20))();
  }
  this_00 = (TreeModel *)operator_new(0x20);
  TreeModel::TreeModel(this_00,(QObject *)0x0);
  this->model = this_00;
  (**(code **)(**(long **)(this->ui + 0x130) + 0x1c8))(*(long **)(this->ui + 0x130),this_00);
  pFVar2 = this->ffsParser;
  if (pFVar2 != (FfsParser *)0x0) {
    FfsParser::~FfsParser(pFVar2);
  }
  operator_delete(pFVar2,200);
  pFVar2 = (FfsParser *)operator_new(200);
  FfsParser::FfsParser(pFVar2,this->model);
  this->ffsParser = pFVar2;
  TreeModel::setMarkingEnabled(this->model,this->markingEnabled);
  QAction::setChecked(SUB81(*(undefined8 *)(this->ui + 0xd8),0));
  pcVar3 = (char *)QAbstractItemView::selectionModel();
  QObject::connect(local_50,pcVar3,
                   (QObject *)"2currentChanged(const QModelIndex &, const QModelIndex &)",
                   (char *)this,0x1a02a2);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  pcVar3 = (char *)QAbstractItemView::selectionModel();
  QObject::connect(local_58,pcVar3,
                   (QObject *)"2selectionChanged(const QItemSelection &, const QItemSelection &)",
                   (char *)this,0x1a0305);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  QObject::connect(local_60,*(char **)(this->ui + 0x168),
                   (QObject *)"2itemDoubleClicked(QListWidgetItem*)",(char *)this,0x1a034e);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  QObject::connect(local_68,*(char **)(this->ui + 0x168),(QObject *)"2itemEntered(QListWidgetItem*)"
                   ,(char *)this,0x1a038f);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  QObject::connect(local_70,*(char **)(this->ui + 0x1b8),
                   (QObject *)"2itemDoubleClicked(QListWidgetItem*)",(char *)this,0x1a034e);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  QObject::connect(local_78,*(char **)(this->ui + 0x1b8),(QObject *)"2itemEntered(QListWidgetItem*)"
                   ,(char *)this,0x1a038f);
  QMetaObject::Connection::~Connection((Connection *)local_78);
  QObject::connect(local_80,*(char **)(this->ui + 0x1d0),
                   (QObject *)"2itemDoubleClicked(QListWidgetItem*)",(char *)this,0x1a034e);
  QMetaObject::Connection::~Connection((Connection *)local_80);
  QObject::connect(local_88,*(char **)(this->ui + 0x1d0),(QObject *)"2itemEntered(QListWidgetItem*)"
                   ,(char *)this,0x1a038f);
  QMetaObject::Connection::~Connection((Connection *)local_88);
  QObject::connect(local_90,*(char **)(this->ui + 0x188),
                   (QObject *)"2itemDoubleClicked(QTableWidgetItem*)",(char *)this,0x1a03e2);
  QMetaObject::Connection::~Connection((Connection *)local_90);
  QObject::connect(local_98,*(char **)(this->ui + 0x150),(QObject *)"2currentChanged(int)",
                   (char *)this,0x1a041a);
  QMetaObject::Connection::~Connection((Connection *)local_98);
  QObject::installEventFilter(*(QObject **)(this->ui + 0x168));
  QObject::installEventFilter(*(QObject **)(this->ui + 0x1b8));
  QObject::installEventFilter(*(QObject **)(this->ui + 0x1d0));
  QGuiApplication::palette();
  QPalette::color(&palette,Active,Base);
  iVar1 = QColor::lightness();
  if (iVar1 < 0x7f) {
    TreeModel::setMarkingDarkMode(this->model,true);
  }
  iVar1 = QPalette::~QPalette(&palette);
  return iVar1;
}

Assistant:

void UEFITool::init()
{
    // Clear components
    ui->parserMessagesListWidget->clear();
    ui->finderMessagesListWidget->clear();
    ui->fitTableWidget->clear();
    ui->fitTableWidget->setRowCount(0);
    ui->fitTableWidget->setColumnCount(0);
    ui->infoEdit->clear();
    ui->securityEdit->clear();
    ui->messagesTabWidget->setTabEnabled(TAB_FIT, false);
    ui->messagesTabWidget->setTabEnabled(TAB_SECURITY, false);
    ui->messagesTabWidget->setTabEnabled(TAB_SEARCH, false);
    ui->messagesTabWidget->setTabEnabled(TAB_BUILDER, false);
    
    // Set window title
    setWindowTitle(tr("UEFITool %1").arg(version));
    
    // Disable menus
    ui->actionSearch->setEnabled(false);
    ui->actionGoToBase->setEnabled(false);
    ui->actionGoToAddress->setEnabled(false);
    ui->menuCapsuleActions->setEnabled(false);
    ui->menuImageActions->setEnabled(false);
    ui->menuRegionActions->setEnabled(false);
    ui->menuPaddingActions->setEnabled(false);
    ui->menuVolumeActions->setEnabled(false);
    ui->menuFileActions->setEnabled(false);
    ui->menuSectionActions->setEnabled(false);
    ui->menuStoreActions->setEnabled(false);
    ui->menuEntryActions->setEnabled(false);
    ui->menuMessageActions->setEnabled(false);
    
    // Create new model ...
    delete model;
    model = new TreeModel();
    ui->structureTreeView->setModel(model);
    // ... and ffsParser
    delete ffsParser;
    ffsParser = new FfsParser(model);
    
    // Set proper marking state
    model->setMarkingEnabled(markingEnabled);
    ui->actionToggleBootGuardMarking->setChecked(markingEnabled);
    
    // Connect signals to slots
    connect(ui->structureTreeView->selectionModel(), SIGNAL(currentChanged(const QModelIndex &, const QModelIndex &)),
            this, SLOT(populateUi(const QModelIndex &)));
    connect(ui->structureTreeView->selectionModel(), SIGNAL(selectionChanged(const QItemSelection &, const QItemSelection &)),
            this, SLOT(populateUi(const QItemSelection &)));
    connect(ui->parserMessagesListWidget,  SIGNAL(itemDoubleClicked(QListWidgetItem*)), this, SLOT(scrollTreeView(QListWidgetItem*)));
    connect(ui->parserMessagesListWidget,  SIGNAL(itemEntered(QListWidgetItem*)),       this, SLOT(enableMessagesCopyActions(QListWidgetItem*)));
    connect(ui->finderMessagesListWidget,  SIGNAL(itemDoubleClicked(QListWidgetItem*)), this, SLOT(scrollTreeView(QListWidgetItem*)));
    connect(ui->finderMessagesListWidget,  SIGNAL(itemEntered(QListWidgetItem*)),       this, SLOT(enableMessagesCopyActions(QListWidgetItem*)));
    connect(ui->builderMessagesListWidget, SIGNAL(itemDoubleClicked(QListWidgetItem*)), this, SLOT(scrollTreeView(QListWidgetItem*)));
    connect(ui->builderMessagesListWidget, SIGNAL(itemEntered(QListWidgetItem*)),       this, SLOT(enableMessagesCopyActions(QListWidgetItem*)));
    connect(ui->fitTableWidget, SIGNAL(itemDoubleClicked(QTableWidgetItem*)), this, SLOT(scrollTreeView(QTableWidgetItem*)));
    connect(ui->messagesTabWidget, SIGNAL(currentChanged(int)), this, SLOT(currentTabChanged(int)));
    
    // Allow enter/return pressing to scroll tree view
    ui->parserMessagesListWidget->installEventFilter(this);
    ui->finderMessagesListWidget->installEventFilter(this);
    ui->builderMessagesListWidget->installEventFilter(this);

    // Detect and set UI light or dark mode
#if QT_VERSION_MAJOR >= 6
#if QT_VERSION_MINOR < 5
#if defined Q_OS_WIN
    QSettings settings("HKEY_CURRENT_USER\\Software\\Microsoft\\Windows\\CurrentVersion\\Themes\\Personalize", QSettings::NativeFormat);
    if (settings.value("AppsUseLightTheme", 1).toInt() == 0) {
        model->setMarkingDarkMode(true);
        QApplication::setStyle(QStyleFactory::create("Fusion"));
        QApplication::setPalette(QApplication::style()->standardPalette());
    }
#else
    const QPalette palette = QApplication::palette();
    const QColor& color = palette.color(QPalette::Active, QPalette::Base);
    if (color.lightness() < 127) { // TreeView has dark background
        model->setMarkingDarkMode(true);
    }
#endif // defined Q_OS_WIN
#else // QT_VERSION_MINOR >= 5
    // Qt 6.5.0 added proper support for dark UI mode, including detection and notification on mode change
    // It also supposed to work in all OSes, but still requires changing the default style on Windows from Vista to Fusion
    auto styleHints = QGuiApplication::styleHints();
    model->setMarkingDarkMode(styleHints->colorScheme() == Qt::ColorScheme::Dark);
    connect(styleHints, SIGNAL(colorSchemeChanged(Qt::ColorScheme)), this, SLOT(updateUiForNewColorScheme(Qt::ColorScheme)));

#if defined Q_OS_WIN
    QApplication::setStyle(QStyleFactory::create("Fusion"));
    QApplication::setPalette(QApplication::style()->standardPalette());
#endif
#endif // QT_VERSION_MINOR
#endif // QT_VERSION_MAJOR
}